

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client.cpp
# Opt level: O0

void CClient::ConchainWindowScreen
               (IResult *pResult,void *pUserData,FCommandCallback pfnCallback,
               void *pCallbackUserData)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  IEngineGraphics *pIVar4;
  CConfig *pCVar5;
  undefined8 in_RCX;
  code *in_RDX;
  CClient *in_RSI;
  IResult *in_RDI;
  CClient *pSelf;
  
  pIVar4 = Graphics(in_RSI);
  if ((pIVar4 == (IEngineGraphics *)0x0) ||
     (iVar1 = IConsole::IResult::NumArguments(in_RDI), iVar1 == 0)) {
    (*in_RDX)(in_RDI,in_RCX);
  }
  else {
    pCVar5 = Config(in_RSI);
    iVar1 = pCVar5->m_GfxScreen;
    iVar2 = (*in_RDI->_vptr_IResult[2])(in_RDI,0);
    if (iVar1 != iVar2) {
      uVar3 = (*in_RDI->_vptr_IResult[2])(in_RDI,0);
      (*(in_RSI->super_IClient).super_IInterface._vptr_IInterface[0xd])(in_RSI,(ulong)uVar3);
    }
  }
  return;
}

Assistant:

void CClient::ConchainWindowScreen(IConsole::IResult *pResult, void *pUserData, IConsole::FCommandCallback pfnCallback, void *pCallbackUserData)
{
	CClient *pSelf = (CClient *)pUserData;
	if(pSelf->Graphics() && pResult->NumArguments())
	{
		if(pSelf->Config()->m_GfxScreen != pResult->GetInteger(0))
			pSelf->SwitchWindowScreen(pResult->GetInteger(0));
	}
	else
		pfnCallback(pResult, pCallbackUserData);
}